

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Gridded_Data_PDU::Decode(Gridded_Data_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT8 AxisType_00;
  KUINT16 KVar1;
  GridAxisIrregular *pGVar2;
  KException *pKVar3;
  int iVar4;
  undefined7 in_register_00000011;
  byte bVar5;
  KUINT8 InterleafFactor;
  KUINT8 AxisType;
  KUINT16 SmpTyp;
  KUINT16 DtRep;
  KUINT16 PointsXi;
  allocator<char> local_81;
  KString local_80;
  KFLOAT64 InitialXi;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>
  *local_58;
  KFLOAT64 FinalXi;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>
  *local_48;
  KUINT8 *local_40;
  KUINT8 *local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (iVar4 + (uint)KVar1 < 0x40) {
    pKVar3 = (KException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"Decode",(allocator<char> *)&InitialXi);
    KException::KException(pKVar3,&local_80,2);
    __cxa_throw(pKVar3,&KException::typeinfo,KException::~KException);
  }
  local_48 = (vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>
              *)&this->m_vpGridAxisDesc;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  ::clear((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
           *)local_48);
  local_58 = (vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>
              *)&this->m_vGridData;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ::clear((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
           *)local_58);
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  (*(this->m_EnvProcID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EnvProcID,stream);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16FieldNum);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16PDUNum);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16PDUTotal);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16CordSys);
  local_38 = &this->m_ui8NumAxis;
  KDataStream::Read(stream,local_38);
  KDataStream::Read(stream,&this->m_ui8ConstGrid);
  (*(this->m_EnvType).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EnvType,stream);
  (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Ori,stream);
  KDataStream::Read<unsigned_long_long>(stream,&this->m_ui64SampleTime);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32TotalValues);
  local_40 = &this->m_ui8VecDim;
  KDataStream::Read(stream,local_40);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
  KDataStream::Read(stream,&this->m_ui8Padding1);
  InitialXi = 0.0;
  FinalXi = 0.0;
  PointsXi = 0;
  InterleafFactor = '\0';
  AxisType = '\0';
  for (bVar5 = 0; bVar5 < *local_38; bVar5 = bVar5 + 1) {
    KDataStream::Read<double>(stream,(double *)&InitialXi);
    KDataStream::Read<double>(stream,(double *)&FinalXi);
    KDataStream::Read<unsigned_short>(stream,&PointsXi);
    KDataStream::Read(stream,&InterleafFactor);
    KDataStream::Read(stream,&AxisType);
    AxisType_00 = AxisType;
    if (AxisType == '\0') {
      pGVar2 = (GridAxisIrregular *)operator_new(0x20);
      DATA_TYPE::GridAxisRegular::GridAxisRegular
                ((GridAxisRegular *)pGVar2,InitialXi,FinalXi,PointsXi,InterleafFactor,'\0',stream);
      local_80._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00336018;
      local_80._M_string_length = (size_type)pGVar2;
      local_80.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_80.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>
                (local_48,(KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)&local_80);
    }
    else {
      pGVar2 = (GridAxisIrregular *)operator_new(0x60);
      DATA_TYPE::GridAxisIrregular::GridAxisIrregular
                (pGVar2,InitialXi,FinalXi,PointsXi,InterleafFactor,AxisType_00,stream);
      local_80._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00336018;
      local_80._M_string_length = (size_type)pGVar2;
      local_80.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_80.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>
                (local_48,(KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)&local_80);
    }
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>::~KRef_Ptr
              ((KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)&local_80);
  }
  SmpTyp = 0;
  DtRep = 0;
  if (*local_40 == '\0') {
    return;
  }
  KDataStream::Read<unsigned_short>(stream,&SmpTyp);
  KDataStream::Read<unsigned_short>(stream,&DtRep);
  if (DtRep != 2) {
    if (DtRep != 1) {
      if (DtRep != 0) goto LAB_002a0f14;
      pGVar2 = (GridAxisIrregular *)operator_new(0x30);
      DATA_TYPE::GridDataType0::GridDataType0((GridDataType0 *)pGVar2,SmpTyp,0,stream);
      local_80._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00336048;
      local_80._M_string_length = (size_type)pGVar2;
      local_80.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_80.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>
                (local_58,(KRef_Ptr<KDIS::DATA_TYPE::GridData> *)&local_80);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::~KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::GridData> *)&local_80);
    }
    KVar1 = DtRep;
    pGVar2 = (GridAxisIrregular *)operator_new(0x38);
    DATA_TYPE::GridDataType1::GridDataType1((GridDataType1 *)pGVar2,SmpTyp,KVar1,stream);
    local_80._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00336048;
    local_80._M_string_length = (size_type)pGVar2;
    local_80.field_2._M_allocated_capacity = (size_type)operator_new(2);
    *(undefined2 *)local_80.field_2._M_allocated_capacity = 1;
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>
    ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>
              (local_58,(KRef_Ptr<KDIS::DATA_TYPE::GridData> *)&local_80);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::~KRef_Ptr
              ((KRef_Ptr<KDIS::DATA_TYPE::GridData> *)&local_80);
  }
  KVar1 = DtRep;
  pGVar2 = (GridAxisIrregular *)operator_new(0x30);
  DATA_TYPE::GridDataType2::GridDataType2((GridDataType2 *)pGVar2,SmpTyp,KVar1,stream);
  local_80._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00336048;
  local_80._M_string_length = (size_type)pGVar2;
  local_80.field_2._M_allocated_capacity = (size_type)operator_new(2);
  *(undefined2 *)local_80.field_2._M_allocated_capacity = 1;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>
  ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>
            (local_58,(KRef_Ptr<KDIS::DATA_TYPE::GridData> *)&local_80);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::~KRef_Ptr
            ((KRef_Ptr<KDIS::DATA_TYPE::GridData> *)&local_80);
LAB_002a0f14:
  pKVar3 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Decode",&local_81);
  KException::KException<char_const*>(pKVar3,&local_80,9,"Unknown Grid Data Representation");
  __cxa_throw(pKVar3,&KException::typeinfo,KException::~KException);
}

Assistant:

void Gridded_Data_PDU::Decode(KDataStream &stream, bool ignoreHeader) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < GRIDDED_DATA_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vpGridAxisDesc.clear();
    m_vGridData.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EnvProcID
           >> m_ui16FieldNum
           >> m_ui16PDUNum
           >> m_ui16PDUTotal
           >> m_ui16CordSys
           >> m_ui8NumAxis
           >> m_ui8ConstGrid
           >> KDIS_STREAM m_EnvType
           >> KDIS_STREAM m_Ori
           >> m_ui64SampleTime
           >> m_ui32TotalValues
           >> m_ui8VecDim
           >> m_ui16Padding1
           >> m_ui8Padding1;

    // We must first decode 4 other values before we can get to the grid axis type so
    // a special constructor is provided in the grid axis classes so that we can pass half the decoded data.
    KFLOAT64 InitialXi = 0;
    KFLOAT64 FinalXi = 0;
    KUINT16 PointsXi = 0;
    KUINT8 InterleafFactor = 0;
    KUINT8 AxisType = 0;
    for( KUINT8 i = 0; i < m_ui8NumAxis; ++i )
    {
        stream >> InitialXi
               >> FinalXi
               >> PointsXi
               >> InterleafFactor
               >> AxisType;

        if( AxisType == 0 )
        {
            // Regular grid
            m_vpGridAxisDesc.push_back( new GridAxisRegular( InitialXi, FinalXi, PointsXi, InterleafFactor, AxisType, stream ) );
        }
        else
        {
            // Irregular grid.
            m_vpGridAxisDesc.push_back( new GridAxisIrregular( InitialXi, FinalXi, PointsXi, InterleafFactor, AxisType, stream ) );
        }
    }

    // We must first decode 2 other values before we can get to the grid data type so
    // a special constructor is provided in the grid data type classes so that we can pass half the decoded data.
    KUINT16 SmpTyp = 0;
    KUINT16 DtRep = 0;

    for( KUINT8 j = 0; j < m_ui8VecDim; ++j )
    {
        stream >> SmpTyp
               >> DtRep;

        switch( DtRep )
        {
        case 0:
            m_vGridData.push_back( new GridDataType0( SmpTyp, DtRep, stream ) );
        case 1 :
            m_vGridData.push_back( new GridDataType1( SmpTyp, DtRep, stream ) );
        case 2:
            m_vGridData.push_back( new GridDataType2( SmpTyp, DtRep, stream ) );
        default:
            throw KException( __FUNCTION__, UNSUPPORTED_DATATYPE, "Unknown Grid Data Representation" );
        }
    }
}